

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O2

void __thiscall ConcurrentStack<int>::push(ConcurrentStack<int> *this,int *item)

{
  size_type sVar1;
  ostream *poVar2;
  undefined1 local_48 [8];
  unique_lock<std::mutex> mlock;
  
  mlock._8_8_ = item;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_48,&this->mutex_);
  while (this->bounded_ == true) {
    sVar1 = std::deque<int,_std::allocator<int>_>::size((deque<int,_std::allocator<int>_> *)this);
    if (sVar1 < this->max_size_) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t push : queue is full !\n");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
              (&this->queue_full_,(unique_lock<std::mutex> *)local_48,&this->timeout_);
  }
  std::deque<int,std::allocator<int>>::emplace_back<int_const>
            ((deque<int,_std::allocator<int>_> *)this,(int *)mlock._8_8_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void push(const T&& item) {
        {
            std::unique_lock<std::mutex> mlock(mutex_);
            while (bounded_ && stack_.size() >= max_size_) {
                std::cout  << "Can't push : queue is full !\n" << std::endl;
                queue_full_.wait_for(mlock, timeout_);
            }
            stack_.emplace(std::move(item));
        }
        queue_empty_.notify_one();
    }